

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O2

CubicSplinePtr __thiscall OpenMD::EAM::getPhi(EAM *this,AtomType *atomType1,AtomType *atomType2)

{
  double dVar1;
  EAMMixingMethod EVar2;
  RealType RVar3;
  RealType RVar4;
  RealType RVar5;
  RealType kappa;
  RealType lambda;
  RealType re;
  RealType A;
  RealType B;
  RealType alpha;
  RealType beta;
  RealType kappa_00;
  RealType lambda_00;
  RealType RVar6;
  EAMType EVar7;
  int iVar8;
  AtomType *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  EAM *pEVar9;
  pointer pEVar10;
  pointer pEVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  _Base_ptr p_Var17;
  RealType RVar18;
  _Base_ptr p_Var19;
  RealType RVar20;
  _Base_ptr p_Var21;
  RealType RVar22;
  CubicSplinePtr CVar23;
  double local_178;
  EAMAdapter ea2;
  double local_168;
  EAMAdapter ea1;
  RealType phab;
  _Base_ptr local_150;
  EAM *local_148;
  RealType r;
  RealType local_138;
  EAM *local_130;
  RealType r_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  vector<double,_std::allocator<double>_> rvals;
  vector<double,_std::allocator<double>_> phivals_1;
  double local_e0;
  vector<double,_std::allocator<double>_> phivals;
  CubicSplinePtr rho2;
  CubicSplinePtr rho1;
  
  ea1.at_ = atomType2;
  local_130 = (EAM *)atomType1;
  std::make_shared<OpenMD::CubicSpline>();
  phab = 0.0;
  rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  phivals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  phivals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  phivals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  EVar7 = EAMAdapter::getEAMType(&ea1);
  local_148 = this;
  if (EVar7 == eamFuncfl) {
    EVar7 = EAMAdapter::getEAMType(&ea2);
    if (EVar7 == eamFuncfl) {
      EAMAdapter::getZSpline((EAMAdapter *)&phivals_1);
      EAMAdapter::getZSpline((EAMAdapter *)&r_1);
      EAMAdapter::getRhoSpline((EAMAdapter *)&rho1);
      EAMAdapter::getRhoSpline((EAMAdapter *)&rho2);
      p_Var19 = (_Base_ptr)EAMAdapter::getRcut(&ea1);
      iVar8 = EAMAdapter::getNr(&ea1);
      RVar3 = EAMAdapter::getDr(&ea1);
      local_150 = (_Base_ptr)EAMAdapter::getRcut(&ea2);
      iVar13 = EAMAdapter::getNr(&ea2);
      local_138 = EAMAdapter::getDr(&ea2);
      RVar20 = EAMAdapter::getDr(&ea1);
      RVar4 = EAMAdapter::getDr(&ea2);
      uVar15 = SUB84(RVar4,0);
      uVar16 = (undefined4)((ulong)RVar4 >> 0x20);
      if ((double)p_Var19 <= 0.0) {
        p_Var19 = (_Base_ptr)0x0;
      }
      p_Var17 = (_Base_ptr)(RVar3 * (double)iVar8);
      if (RVar3 * (double)iVar8 <= (double)p_Var19) {
        p_Var17 = p_Var19;
      }
      p_Var19 = local_150;
      if ((double)local_150 <= (double)p_Var17) {
        p_Var19 = p_Var17;
      }
      p_Var17 = (_Base_ptr)(local_138 * (double)iVar13);
      if (local_138 * (double)iVar13 <= (double)p_Var19) {
        p_Var17 = p_Var19;
      }
      if (RVar20 <= RVar4) {
        uVar15 = SUB84(RVar20,0);
        uVar16 = (undefined4)((ulong)RVar20 >> 0x20);
      }
      iVar8 = (int)((double)p_Var17 / (double)CONCAT44(uVar16,uVar15) + 0.5);
      iVar13 = 0;
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      for (; iVar8 != iVar13; iVar13 = iVar13 + 1) {
        local_e0 = (double)iVar13 * (double)CONCAT44(uVar16,uVar15);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&rvals,&local_e0);
      }
      local_e0 = 0.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&phivals,&local_e0);
      uVar12 = 1;
      while( true ) {
        pEVar9 = local_148;
        if ((ulong)((long)rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) <= uVar12) break;
        dVar1 = rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12];
        r = dVar1;
        RVar3 = EAMAdapter::getRcut(&ea1);
        local_178 = 0.0;
        if (dVar1 <= RVar3) {
          local_178 = CubicSpline::getValueAt
                                (rho1.
                                 super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,&r);
        }
        local_150 = (_Base_ptr)r;
        RVar3 = EAMAdapter::getRcut(&ea2);
        local_168 = 0.0;
        if ((double)local_150 <= RVar3) {
          local_168 = CubicSpline::getValueAt
                                (rho2.
                                 super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,&r);
        }
        local_150 = (_Base_ptr)r;
        RVar3 = EAMAdapter::getRcut(&ea1);
        local_138 = 0.0;
        if ((double)local_150 <= RVar3) {
          local_138 = CubicSpline::getValueAt
                                ((CubicSpline *)
                                 phivals_1.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start,&r);
        }
        local_150 = (_Base_ptr)r;
        RVar3 = EAMAdapter::getRcut(&ea2);
        RVar20 = 0.0;
        if ((double)local_150 <= RVar3) {
          RVar20 = CubicSpline::getValueAt((CubicSpline *)r_1,&r);
        }
        RVar3 = r;
        EVar2 = local_130->mixMeth_;
        if ((EVar2 - eamDream1 < 2) || (EVar2 == eamJohnson)) {
          phab = 0.0;
          if (0.0 < local_178) {
            phab = (local_168 / local_178) * 0.5 *
                   ((local_138 * local_138 *
                    *(double *)&((_Rb_tree_header *)&local_130->pre11_)->_M_header) / r) + 0.0;
          }
          if (0.0 < local_168) {
            phab = (local_178 / local_168) * 0.5 *
                   ((RVar20 * RVar20 *
                    *(double *)&((_Rb_tree_header *)&local_130->pre11_)->_M_header) / r) + phab;
          }
        }
        else if (EVar2 == eamDaw) {
          RVar4 = EAMAdapter::getRcut(&ea1);
          RVar5 = r;
          if (RVar3 <= RVar4) {
            RVar3 = EAMAdapter::getRcut(&ea2);
            if (RVar5 <= RVar3) {
              phab = (local_138 * RVar20 *
                     *(double *)&((_Rb_tree_header *)&local_130->pre11_)->_M_header) / r;
              goto LAB_002130c8;
            }
          }
          phab = 0.0;
        }
        else {
          builtin_strncpy(painCave.errMsg,
                          "EAM::getPhi hit a mixing method it doesn\'t know about!\n",0x38);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
LAB_002130c8:
        std::vector<double,_std::allocator<double>_>::push_back(&phivals,&phab);
        uVar12 = (ulong)((int)uVar12 + 1);
      }
      CubicSpline::addPoints
                ((CubicSpline *)
                 (local_148->super_MetallicInteraction).super_NonBondedInteraction.
                 _vptr_NonBondedInteraction,&rvals,&phivals);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rho2.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rho1.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &phivals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      goto LAB_00212cae;
    }
  }
  iVar8 = AtomType::getIdent(atomType2);
  pEVar9 = local_130;
  pEVar11 = (local_130->EAMdata).
            super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
            super__Vector_impl_data._M_start +
            *(int *)((long)&((AtomType *)
                            (local_130->EAMtids).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start)->_vptr_AtomType +
                    (long)iVar8 * 4);
  iVar8 = AtomType::getIdent(in_RCX);
  pEVar10 = (pEVar9->EAMdata).
            super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
            super__Vector_impl_data._M_start +
            *(int *)((long)&((AtomType *)
                            (pEVar9->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start)->_vptr_AtomType + (long)iVar8 * 4);
  local_138 = EAMAdapter::getRe(&ea1);
  RVar3 = EAMAdapter::getA(&ea1);
  RVar20 = EAMAdapter::getB(&ea1);
  RVar4 = EAMAdapter::getAlpha(&ea1);
  RVar5 = EAMAdapter::getBeta(&ea1);
  kappa = EAMAdapter::getKappa(&ea1);
  lambda = EAMAdapter::getLambda(&ea1);
  re = EAMAdapter::getRe(&ea2);
  A = EAMAdapter::getA(&ea2);
  B = EAMAdapter::getB(&ea2);
  alpha = EAMAdapter::getAlpha(&ea2);
  beta = EAMAdapter::getBeta(&ea2);
  kappa_00 = EAMAdapter::getKappa(&ea2);
  lambda_00 = EAMAdapter::getLambda(&ea2);
  local_150 = (_Base_ptr)pEVar11->rcut;
  p_Var19 = (_Base_ptr)pEVar10->rcut;
  p_Var17 = (_Base_ptr)pEVar9->eamRcut_;
  RVar18 = CubicSpline::getSpacing
                     ((CubicSpline *)
                      *(AtomType **)
                       &(pEVar11->rho).
                        super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>);
  RVar22 = CubicSpline::getSpacing
                     ((CubicSpline *)
                      *(AtomType **)
                       &(pEVar10->rho).
                        super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>);
  uVar15 = SUB84(RVar22,0);
  uVar16 = (undefined4)((ulong)RVar22 >> 0x20);
  p_Var21 = local_150;
  if ((double)local_150 <= 0.0) {
    p_Var21 = (_Base_ptr)0x0;
  }
  if ((double)p_Var19 <= (double)p_Var21) {
    p_Var19 = p_Var21;
  }
  if ((double)p_Var17 <= (double)p_Var19) {
    p_Var17 = p_Var19;
  }
  if (RVar18 <= RVar22) {
    uVar15 = SUB84(RVar18,0);
    uVar16 = (undefined4)((ulong)RVar18 >> 0x20);
  }
  iVar13 = (int)((double)p_Var17 / (double)CONCAT44(uVar16,uVar15) + 1.0);
  iVar8 = 0;
  if (iVar13 < 1) {
    iVar13 = 0;
  }
  for (; iVar13 != iVar8; iVar8 = iVar8 + 1) {
    phivals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((double)iVar8 * (double)CONCAT44(uVar16,uVar15));
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&rvals,(double *)&phivals_1);
  }
  phivals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  phivals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  phivals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar14 = 0;
  while( true ) {
    pEVar9 = local_148;
    if ((ulong)((long)rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)uVar14) break;
    r_1 = rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar14];
    phab = 0.0;
    RVar22 = 0.0;
    RVar18 = 0.0;
    if (r_1 < pEVar11->rcut) {
      RVar18 = CubicSpline::getValueAt
                         ((CubicSpline *)
                          *(AtomType **)
                           &(pEVar11->rho).
                            super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,&r_1
                         );
      RVar22 = Phi(local_130,r_1,local_138,RVar3,RVar20,RVar4,RVar5,kappa,lambda);
    }
    uVar16 = 0;
    uVar15 = 0;
    p_Var19 = (_Base_ptr)0x0;
    if (r_1 < pEVar10->rcut) {
      local_150 = (_Base_ptr)
                  CubicSpline::getValueAt
                            ((CubicSpline *)
                             *(AtomType **)
                              &(pEVar10->rho).
                               super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
                             &r_1);
      RVar6 = Phi(local_130,r_1,re,A,B,alpha,beta,kappa_00,lambda_00);
      uVar15 = SUB84(RVar6,0);
      uVar16 = (undefined4)((ulong)RVar6 >> 0x20);
      p_Var19 = local_150;
    }
    if (r_1 < pEVar11->rcut) {
      phab = ((double)p_Var19 / RVar18) * 0.5 * RVar22 + phab;
    }
    if (r_1 < pEVar10->rcut) {
      phab = (RVar18 / (double)p_Var19) * 0.5 * (double)CONCAT44(uVar16,uVar15) + phab;
    }
    std::vector<double,_std::allocator<double>_>::push_back(&phivals_1,&phab);
    uVar14 = uVar14 + 1;
  }
  CubicSpline::addPoints
            ((CubicSpline *)
             (local_148->super_MetallicInteraction).super_NonBondedInteraction.
             _vptr_NonBondedInteraction,&rvals,&phivals_1);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&phivals_1.super__Vector_base<double,_std::allocator<double>_>);
LAB_00212cae:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&phivals.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rvals.super__Vector_base<double,_std::allocator<double>_>);
  CVar23.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar23.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pEVar9;
  return (CubicSplinePtr)CVar23.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CubicSplinePtr EAM::getPhi(AtomType* atomType1, AtomType* atomType2) {
    EAMAdapter ea1 = EAMAdapter(atomType1);
    EAMAdapter ea2 = EAMAdapter(atomType2);

    CubicSplinePtr cs {std::make_shared<CubicSpline>()};

    RealType rha(0.0), rhb(0.0), pha(0.0), phb(0.0), phab(0.0);
    vector<RealType> rvals;
    vector<RealType> phivals;
    RealType rmax(0.0), dr, r;
    int nr;

    if (ea1.getEAMType() == eamFuncfl && ea2.getEAMType() == eamFuncfl) {
      CubicSplinePtr z1   = ea1.getZSpline();
      CubicSplinePtr z2   = ea2.getZSpline();
      CubicSplinePtr rho1 = ea1.getRhoSpline();
      CubicSplinePtr rho2 = ea2.getRhoSpline();

      // make the r grid:

      // we need phi out to the largest value we'll encounter in the
      // radial space;

      rmax = max(rmax, ea1.getRcut());
      rmax = max(rmax, ea1.getNr() * ea1.getDr());

      rmax = max(rmax, ea2.getRcut());
      rmax = max(rmax, ea2.getNr() * ea2.getDr());

      // use the smallest dr (finest grid) to build our grid:

      dr = min(ea1.getDr(), ea2.getDr());
      nr = int(rmax / dr + 0.5);

      for (int i = 0; i < nr; i++)
        rvals.push_back(RealType(i * dr));

      // construct the pair potential:

      RealType za, zb;

      phivals.push_back(0.0);

      for (unsigned int i = 1; i < rvals.size(); i++) {
        r = rvals[i];

        // only use z(r) if we're inside this atom's cutoff radius,
        // otherwise, we'll use zero for the charge.  This effectively
        // means that our phi grid goes out beyond the cutoff of the
        // pair potential

        rha = r <= ea1.getRcut() ? rho1->getValueAt(r) : 0.0;
        rhb = r <= ea2.getRcut() ? rho2->getValueAt(r) : 0.0;

        za = r <= ea1.getRcut() ? z1->getValueAt(r) : 0.0;
        zb = r <= ea2.getRcut() ? z2->getValueAt(r) : 0.0;

        switch (mixMeth_) {
        case eamJohnson:
        case eamDream1:
        case eamDream2:
          phab = 0.0;
          if (rha > 0.0) {
            pha  = pre11_ * (za * za) / r;
            phab = phab + 0.5 * (rhb / rha) * pha;
          }
          if (rhb > 0.0) {
            phb  = pre11_ * (zb * zb) / r;
            phab = phab + 0.5 * (rha / rhb) * phb;
          }

          break;

        case eamDaw:
          if (r <= ea1.getRcut() && r <= ea2.getRcut()) {
            phab = pre11_ * (za * zb) / r;
          } else {
            phab = 0.0;
          }

          break;
        case eamUnknownMix:
        default:

          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "EAM::getPhi hit a mixing method it doesn't know about!\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
        phivals.push_back(phab);
      }
      cs->addPoints(rvals, phivals);
    } else {
      EAMAtomData& data1 = EAMdata[EAMtids[atomType1->getIdent()]];
      EAMAtomData& data2 = EAMdata[EAMtids[atomType2->getIdent()]];

      RealType re1, A1, B1, alpha1, beta1, kappa1, lambda1;
      RealType re2, A2, B2, alpha2, beta2, kappa2, lambda2;

      re1     = ea1.getRe();
      A1      = ea1.getA();
      B1      = ea1.getB();
      alpha1  = ea1.getAlpha();
      beta1   = ea1.getBeta();
      kappa1  = ea1.getKappa();
      lambda1 = ea1.getLambda();

      re2     = ea2.getRe();
      A2      = ea2.getA();
      B2      = ea2.getB();
      alpha2  = ea2.getAlpha();
      beta2   = ea2.getBeta();
      kappa2  = ea2.getKappa();
      lambda2 = ea2.getLambda();

      RealType rmax = 0.0;
      rmax          = max(rmax, data1.rcut);
      rmax          = max(rmax, data2.rcut);
      rmax          = max(rmax, eamRcut_);

      // use the smallest dr (finest grid) to build our grid:

      RealType dr = min(data1.rho->getSpacing(), data2.rho->getSpacing());

      int nr = int(rmax / dr + 1);

      for (int i = 0; i < nr; i++)
        rvals.push_back(RealType(i * dr));

      vector<RealType> phivals;
      RealType r;

      for (unsigned int i = 0; i < rvals.size(); i++) {
        r    = rvals[i];
        rha  = 0.0;
        rhb  = 0.0;
        pha  = 0.0;
        phb  = 0.0;
        phab = 0.0;

        // rcut values are derived parameters if no splines are pre-set:

        if (r < data1.rcut) {
          rha = data1.rho->getValueAt(r);

          // pha = ZhouPhi(r, re1, A1, B1, alpha1, beta1, kappa1, lambda1);
          pha = Phi(r, re1, A1, B1, alpha1, beta1, kappa1, lambda1);
        }
        if (r < data2.rcut) {
          rhb = data2.rho->getValueAt(r);
          // phb =  ZhouPhi(r, re2, A2, B2, alpha2, beta2, kappa2, lambda2);
          phb = Phi(r, re2, A2, B2, alpha2, beta2, kappa2, lambda2);
        }

        if (r < data1.rcut) phab = phab + 0.5 * (rhb / rha) * pha;
        if (r < data2.rcut) phab = phab + 0.5 * (rha / rhb) * phb;

        phivals.push_back(phab);
      }
      cs->addPoints(rvals, phivals);
    }

    return cs;
  }